

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O3

void __thiscall pstore::broker::recorder::recorder(recorder *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 local_20;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 8) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  pcVar3 = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    uStack_18 = *(undefined4 *)((long)&path->field_2 + 8);
    uStack_14 = *(undefined4 *)((long)&path->field_2 + 0xc);
    pcVar3 = (pointer)&local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar2 = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  (this->file_).super_file_base._vptr_file_base = (_func_int **)&PTR__file_handle_00198720;
  paVar1 = &(this->file_).path_.field_2;
  (this->file_).path_._M_dataplus._M_p = (pointer)paVar1;
  if (pcVar3 == (pointer)&local_20) {
    *(undefined4 *)paVar1 = (undefined4)local_20;
    *(undefined4 *)((long)&(this->file_).path_.field_2 + 4) = local_20._4_4_;
    *(undefined4 *)((long)&(this->file_).path_.field_2 + 8) = uStack_18;
    *(undefined4 *)((long)&(this->file_).path_.field_2 + 0xc) = uStack_14;
  }
  else {
    (this->file_).path_._M_dataplus._M_p = pcVar3;
    (this->file_).path_.field_2._M_allocated_capacity = local_20;
  }
  (this->file_).path_._M_string_length = sVar2;
  local_20 = local_20 & 0xffffffffffffff00;
  (this->file_).file_ = -1;
  (this->file_).is_writable_ = false;
  pstore::file::file_handle::open(&this->file_,(char *)0x0,1,0);
  return;
}

Assistant:

player::~player () = default;